

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

void __thiscall Kumu::PathMatchRegex::PathMatchRegex(PathMatchRegex *this,string *s)

{
  int __errcode;
  char *__pattern;
  ILogSink *this_00;
  char local_b8 [8];
  char buf [128];
  int result;
  string *s_local;
  PathMatchRegex *this_local;
  
  IPathMatch::IPathMatch(&this->super_IPathMatch);
  (this->super_IPathMatch)._vptr_IPathMatch = (_func_int **)&PTR__PathMatchRegex_00146830;
  __pattern = (char *)std::__cxx11::string::c_str();
  __errcode = regcomp((regex_t *)&this->m_regex,__pattern,8);
  if (__errcode != 0) {
    regerror(__errcode,(regex_t *)&this->m_regex,local_b8,0x80);
    this_00 = DefaultLogSink();
    ILogSink::Error(this_00,"PathMatchRegex: %s\n",local_b8);
    regfree((regex_t *)&this->m_regex);
  }
  return;
}

Assistant:

Kumu::PathMatchRegex::PathMatchRegex(const std::string& s)
{
  int result = regcomp(&m_regex, s.c_str(), REG_NOSUB); // (REG_EXTENDED|REG_NOSUB|REG_NEWLINE));

  if ( result )
    {
      char buf[128];
      regerror(result, &m_regex, buf, 128);
      DefaultLogSink().Error("PathMatchRegex: %s\n", buf);
      regfree(&m_regex);
    }
}